

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O3

void ts_range_array_get_changed_ranges
               (TSRange *old_ranges,uint old_range_count,TSRange *new_ranges,uint new_range_count,
               TSRangeArray *differences)

{
  TSRange *pTVar1;
  byte bVar2;
  uint32_t *puVar3;
  ulong uVar4;
  uint32_t uVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  uint32_t uVar10;
  uint uVar11;
  TSRange *pTVar9;
  long lVar12;
  uint32_t uVar13;
  ulong uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  Length end;
  Length end_00;
  Length end_01;
  Length start;
  Length start_00;
  Length start_01;
  
  if (old_range_count != 0 || new_range_count != 0) {
    bVar18 = new_range_count != 0;
    bVar19 = old_range_count != 0;
    uVar4 = 0;
    uVar11 = 0;
    uVar5 = 0;
    bVar17 = 0;
    bVar7 = 0;
    uVar8 = 0;
    do {
      pTVar1 = old_ranges + uVar11;
      if (bVar17 == 0) {
        uVar15 = 0xffffffff;
        uVar13 = 0xffffffff;
        uVar6 = 0xffffffff00000000;
        if (bVar19) {
          puVar3 = &pTVar1->start_byte;
          lVar12 = 4;
          pTVar9 = pTVar1;
          goto LAB_001281ce;
        }
      }
      else {
        puVar3 = &pTVar1->end_byte;
        lVar12 = 0xc;
        pTVar9 = (TSRange *)&pTVar1->end_point;
LAB_001281ce:
        uVar13 = *puVar3;
        uVar15 = *(uint32_t *)((long)&(pTVar1->start_point).row + lVar12);
        uVar6 = (ulong)(pTVar9->start_point).row << 0x20;
      }
      pTVar1 = new_ranges + uVar4;
      if (bVar7 == 0) {
        uVar16 = 0xffffffff;
        uVar10 = 0xffffffff;
        uVar14 = 0xffffffff00000000;
        if (bVar18) {
          puVar3 = &pTVar1->start_byte;
          lVar12 = 4;
          pTVar9 = pTVar1;
          goto LAB_0012822d;
        }
      }
      else {
        puVar3 = &pTVar1->end_byte;
        lVar12 = 0xc;
        pTVar9 = (TSRange *)&pTVar1->end_point;
LAB_0012822d:
        uVar10 = *puVar3;
        uVar16 = *(uint32_t *)((long)&(pTVar1->start_point).row + lVar12);
        uVar14 = (ulong)(pTVar9->start_point).row << 0x20;
      }
      bVar2 = bVar17 ^ bVar7;
      if (uVar13 < uVar10) {
        uVar6 = uVar6 | uVar13;
        if (bVar2 != 0) {
          end.extent.column = uVar15;
          end.bytes = (int)uVar6;
          end.extent.row = (int)(uVar6 >> 0x20);
          start.extent.column = uVar5;
          start.bytes = (int)uVar8;
          start.extent.row = (int)(uVar8 >> 0x20);
          ts_range_array_add(differences,start,end);
        }
        uVar11 = uVar11 + bVar17;
        bVar17 = bVar17 ^ 1;
        uVar5 = uVar15;
      }
      else {
        uVar6 = uVar14 | uVar10;
        if (uVar10 < uVar13) {
          if (bVar2 != 0) {
            end_00.extent.column = uVar16;
            end_00.bytes = (int)uVar6;
            end_00.extent.row = (int)(uVar6 >> 0x20);
            start_00.extent.column = uVar5;
            start_00.bytes = (int)uVar8;
            start_00.extent.row = (int)(uVar8 >> 0x20);
            ts_range_array_add(differences,start_00,end_00);
          }
          uVar4 = (ulong)((int)uVar4 + (uint)bVar7);
          bVar7 = bVar7 ^ 1;
          uVar5 = uVar16;
        }
        else {
          if (bVar2 != 0) {
            end_01.extent.column = uVar16;
            end_01.bytes = (int)uVar6;
            end_01.extent.row = (int)(uVar6 >> 0x20);
            start_01.extent.column = uVar5;
            start_01.bytes = (int)uVar8;
            start_01.extent.row = (int)(uVar8 >> 0x20);
            ts_range_array_add(differences,start_01,end_01);
          }
          uVar11 = uVar11 + bVar17;
          uVar4 = (ulong)((int)uVar4 + (uint)bVar7);
          bVar17 = bVar17 ^ 1;
          bVar7 = bVar7 ^ 1;
          uVar5 = uVar16;
        }
      }
      bVar18 = (uint)uVar4 < new_range_count;
      bVar19 = uVar11 < old_range_count;
      uVar8 = uVar6;
    } while ((bVar19) || ((uint)uVar4 < new_range_count));
  }
  return;
}

Assistant:

void ts_range_array_get_changed_ranges(
  const TSRange *old_ranges, unsigned old_range_count,
  const TSRange *new_ranges, unsigned new_range_count,
  TSRangeArray *differences
) {
  unsigned new_index = 0;
  unsigned old_index = 0;
  Length current_position = length_zero();
  bool in_old_range = false;
  bool in_new_range = false;

  while (old_index < old_range_count || new_index < new_range_count) {
    const TSRange *old_range = &old_ranges[old_index];
    const TSRange *new_range = &new_ranges[new_index];

    Length next_old_position;
    if (in_old_range) {
      next_old_position = (Length) {old_range->end_byte, old_range->end_point};
    } else if (old_index < old_range_count) {
      next_old_position = (Length) {old_range->start_byte, old_range->start_point};
    } else {
      next_old_position = LENGTH_MAX;
    }

    Length next_new_position;
    if (in_new_range) {
      next_new_position = (Length) {new_range->end_byte, new_range->end_point};
    } else if (new_index < new_range_count) {
      next_new_position = (Length) {new_range->start_byte, new_range->start_point};
    } else {
      next_new_position = LENGTH_MAX;
    }

    if (next_old_position.bytes < next_new_position.bytes) {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_old_position);
      }
      if (in_old_range) old_index++;
      current_position = next_old_position;
      in_old_range = !in_old_range;
    } else if (next_new_position.bytes < next_old_position.bytes) {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_new_position);
      }
      if (in_new_range) new_index++;
      current_position = next_new_position;
      in_new_range = !in_new_range;
    } else {
      if (in_old_range != in_new_range) {
        ts_range_array_add(differences, current_position, next_new_position);
      }
      if (in_old_range) old_index++;
      if (in_new_range) new_index++;
      in_old_range = !in_old_range;
      in_new_range = !in_new_range;
      current_position = next_new_position;
    }
  }
}